

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O0

void m68k_op_dbmi_16(void)

{
  uint uVar1;
  uint offset_00;
  uint *puVar2;
  uint offset;
  uint res;
  uint *r_dst;
  
  if ((m68ki_cpu.n_flag & 0x80) == 0) {
    puVar2 = m68ki_cpu.dar + (m68ki_cpu.ir & 7);
    uVar1 = *puVar2 - 1 & 0xffff;
    *puVar2 = *puVar2 & 0xffff0000 | uVar1;
    if (uVar1 == 0xffff) {
      m68ki_cpu.pc = m68ki_cpu.pc + 2;
      m68ki_remaining_cycles = m68ki_remaining_cycles - m68ki_cpu.cyc_dbcc_f_exp;
    }
    else {
      offset_00 = m68ki_read_imm_16();
      m68ki_cpu.pc = m68ki_cpu.pc - 2;
      m68ki_branch_16(offset_00);
      m68ki_remaining_cycles = m68ki_remaining_cycles - m68ki_cpu.cyc_dbcc_f_noexp;
    }
  }
  else {
    m68ki_cpu.pc = m68ki_cpu.pc + 2;
  }
  return;
}

Assistant:

static void m68k_op_dbmi_16(void)
{
	if(COND_NOT_MI())
	{
		uint* r_dst = &DY;
		uint res = MASK_OUT_ABOVE_16(*r_dst - 1);

		*r_dst = MASK_OUT_BELOW_16(*r_dst) | res;
		if(res != 0xffff)
		{
			uint offset = OPER_I_16();
			REG_PC -= 2;
			m68ki_trace_t0();			   /* auto-disable (see m68kcpu.h) */
			m68ki_branch_16(offset);
			USE_CYCLES(CYC_DBCC_F_NOEXP);
			return;
		}
		REG_PC += 2;
		USE_CYCLES(CYC_DBCC_F_EXP);
		return;
	}
	REG_PC += 2;
}